

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O1

void __thiscall
ProxyClient::sendToPipe(ProxyClient *this,uint32_t sessionID,uint8_t *data,int32_t len)

{
  Client *pCVar1;
  bool bVar2;
  ulong uVar3;
  
  if (0 < len) {
    if (len < 0x579) {
      uVar3 = (ulong)(uint)len;
    }
    else {
      do {
        pCVar1 = (this->m_pipe)._M_t.
                 super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
                 super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
                 super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
        (*(pCVar1->super_SessionManager)._vptr_SessionManager[2])
                  (&pCVar1->super_SessionManager,sessionID,data,0x578);
        data = data + 0x578;
        uVar3 = (ulong)(len - 0x578U);
        bVar2 = 0xaf0 < len;
        len = len - 0x578U;
      } while (bVar2);
    }
    pCVar1 = (this->m_pipe)._M_t.
             super___uniq_ptr_impl<net_uv::Client,_std::default_delete<net_uv::Client>_>._M_t.
             super__Tuple_impl<0UL,_net_uv::Client_*,_std::default_delete<net_uv::Client>_>.
             super__Head_base<0UL,_net_uv::Client_*,_false>._M_head_impl;
    (*(pCVar1->super_SessionManager)._vptr_SessionManager[2])
              (&pCVar1->super_SessionManager,sessionID,data,uVar3);
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/ProxyClient.cpp"
                ,0x2c7,"void ProxyClient::sendToPipe(uint32_t, uint8_t *, int32_t)");
}

Assistant:

void ProxyClient::sendToPipe(uint32_t sessionID, uint8_t* data, int32_t len)
{
	if (len <= 0)
	{
		assert(0);
		m_pipe->disconnect(sessionID);
		return;
	}

	do
	{
		if (len <= BLOCK_DATA_SIZE)
		{
			m_pipe->send(sessionID, (char*)data, len);
			break;
		}
		m_pipe->send(sessionID, (char*)data, BLOCK_DATA_SIZE);
		data += BLOCK_DATA_SIZE;
		len -= BLOCK_DATA_SIZE;
	} while (1);
}